

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::setup_meta_chain
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id,uint32_t var_id)

{
  bool bVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  mapped_type *ppPVar4;
  SPIRType *pSVar5;
  SPIRType *type;
  mapped_type *meta;
  uint32_t var_id_local;
  uint32_t type_id_local;
  PhysicalStorageBufferPointerHandler *this_local;
  
  meta._0_4_ = var_id;
  meta._4_4_ = type_id;
  _var_id_local = this;
  bVar1 = type_is_bda_block_entry(this,type_id);
  if (bVar1) {
    pmVar3 = ::std::
             unordered_map<unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
             ::operator[](&this->physical_block_type_meta,(key_type *)((long)&meta + 4));
    ppPVar4 = ::std::
              unordered_map<unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::Compiler::PhysicalBlockMeta_*>_>_>
              ::operator[](&this->access_chain_to_physical_block,(key_type *)&meta);
    *ppPVar4 = pmVar3;
    pSVar5 = get<diligent_spirv_cross::SPIRType>(this->compiler,meta._4_4_);
    bVar1 = is_physical_pointer_to_buffer_block(this->compiler,pSVar5);
    if (!bVar1) {
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&this->non_block_types,(value_type *)((long)&meta + 4));
    }
    if (pmVar3->alignment == 0) {
      pSVar5 = get_pointee_type(this->compiler,pSVar5);
      uVar2 = get_minimum_scalar_alignment(this,pSVar5);
      pmVar3->alignment = uVar2;
    }
  }
  return;
}

Assistant:

void Compiler::PhysicalStorageBufferPointerHandler::setup_meta_chain(uint32_t type_id, uint32_t var_id)
{
	if (type_is_bda_block_entry(type_id))
	{
		auto &meta = physical_block_type_meta[type_id];
		access_chain_to_physical_block[var_id] = &meta;

		auto &type = compiler.get<SPIRType>(type_id);

		if (!compiler.is_physical_pointer_to_buffer_block(type))
			non_block_types.insert(type_id);

		if (meta.alignment == 0)
			meta.alignment = get_minimum_scalar_alignment(compiler.get_pointee_type(type));
	}
}